

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sliding_dft.hpp
# Opt level: O3

bool __thiscall SlidingDFT<double,_64UL>::update(SlidingDFT<double,_64UL> *this,double new_x)

{
  double *pdVar1;
  double *pdVar2;
  undefined8 *puVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  byte bVar15;
  ulong uVar16;
  long lVar17;
  double dVar18;
  double dVar19;
  complex<double> local_48;
  double local_30;
  double local_28;
  
  dVar4 = this->x[this->x_index];
  this->x[this->x_index] = new_x;
  dVar5 = this->damping_factor;
  dVar19 = pow(dVar5,64.0);
  lVar17 = 0x618;
  do {
    local_28 = *(double *)((long)this->x + lVar17 + -8) * dVar5;
    local_30 = (*(double *)((long)this->x + lVar17 + -0x10) * dVar5 - dVar19 * dVar4) + new_x;
    puVar3 = (undefined8 *)((long)this + lVar17 + -0x408);
    local_48._M_value._0_8_ = *puVar3;
    local_48._M_value._8_8_ = puVar3[1];
    std::complex<double>::operator*=(&local_48,(complex<double> *)&local_30);
    puVar3 = (undefined8 *)((long)this->x + lVar17 + -0x10);
    *puVar3 = local_48._M_value._0_8_;
    puVar3[1] = local_48._M_value._8_8_;
    lVar17 = lVar17 + 0x10;
  } while (lVar17 != 0xa18);
  dVar4 = *(double *)this->S[0]._M_value;
  dVar5 = *(double *)(this->S[0]._M_value + 8);
  dVar19 = *(double *)this->S[1]._M_value;
  dVar18 = *(double *)(this->S[1]._M_value + 8);
  dVar6 = *(double *)this->S[0x3f]._M_value;
  dVar7 = *(double *)(this->S[0x3f]._M_value + 8);
  *(double *)this->dft[0]._M_value = (dVar6 + dVar19) * -0.25 + dVar4 * 0.5;
  *(double *)(this->dft[0]._M_value + 8) = (dVar7 + dVar18) * -0.25 + dVar5 * 0.5;
  lVar17 = 0x610;
  do {
    pdVar1 = (double *)((long)this->x + lVar17 + -8);
    dVar8 = *pdVar1;
    dVar9 = pdVar1[1];
    pdVar1 = (double *)((long)this->x + lVar17 + 8);
    dVar10 = pdVar1[1];
    pdVar2 = (double *)((long)this->x + lVar17 + 0x18);
    dVar11 = *pdVar2;
    dVar12 = pdVar2[1];
    pdVar2 = (double *)((long)this->x + lVar17 + 0x28);
    dVar13 = *pdVar2;
    dVar14 = pdVar2[1];
    pdVar2 = (double *)(this->twiddle[0x21]._M_value + lVar17);
    *pdVar2 = dVar11 * 0.5 - (*pdVar1 + dVar13) * 0.25;
    pdVar2[1] = dVar12 * 0.5 - (dVar10 + dVar14) * 0.25;
    pdVar1 = (double *)(this->twiddle[0x20]._M_value + lVar17);
    *pdVar1 = dVar19 * 0.5 - (dVar8 + dVar11) * 0.25;
    pdVar1[1] = dVar18 * 0.5 - (dVar9 + dVar12) * 0.25;
    lVar17 = lVar17 + 0x20;
    dVar18 = dVar14;
    dVar19 = dVar13;
  } while (lVar17 != 0x9f0);
  dVar19 = *(double *)(this->S[0x3e]._M_value + 8);
  *(double *)this->dft[0x3f]._M_value =
       (*(double *)this->S[0x3e]._M_value + dVar4) * -0.25 + dVar6 * 0.5;
  *(double *)(this->dft[0x3f]._M_value + 8) = (dVar19 + dVar5) * -0.25 + dVar7 * 0.5;
  uVar16 = this->x_index + 1;
  this->x_index = uVar16;
  if (uVar16 < 0x40) {
    bVar15 = this->data_valid;
  }
  else {
    this->data_valid = true;
    this->x_index = 0;
    bVar15 = 1;
  }
  return (bool)(bVar15 & 1);
}

Assistant:

bool update(NumberFormat new_x)
	{
		// Update the storage of the time domain values
		const NumberFormat old_x = this->x[this->x_index];
		this->x[this->x_index] = new_x;

		// Update the DFT
		const NumberFormat r = this->damping_factor;
		const NumberFormat r_to_N = pow(r, (NumberFormat)DFT_Length);
		for (size_t k = 0; k < DFT_Length; k++) {
			this->S[k] = this->twiddle[k] * (r * this->S[k] - r_to_N * old_x + new_x);
		}

		// Apply the Hanning window
		this->dft[0] = (NumberFormat)0.5*this->S[0] - (NumberFormat)0.25*(this->S[DFT_Length - 1] + this->S[1]);
		for (size_t k = 1; k < (DFT_Length - 1); k++) {
			this->dft[k] = (NumberFormat)0.5*this->S[k] - (NumberFormat)0.25*(this->S[k - 1] + this->S[k + 1]);
		}
		this->dft[DFT_Length - 1] = (NumberFormat)0.5*this->S[DFT_Length - 1] - (NumberFormat)0.25*(this->S[DFT_Length - 2] + this->S[0]);

		// Increment the counter
		this->x_index++;
		if (this->x_index >= DFT_Length) {
			this->data_valid = true;
			this->x_index = 0;
		}

		// Done.
		return this->data_valid;
	}